

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcPresentationStyle::~IfcPresentationStyle(IfcPresentationStyle *this)

{
  long *plVar1;
  _func_int *p_Var2;
  
  p_Var2 = (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>).
           _vptr_ObjectHelper[-3];
  plVar1 = (long *)(&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>).
                     field_0x20 + (long)p_Var2);
  plVar1[-4] = (long)&PTR__IfcPresentationStyle_00918a90;
  plVar1[3] = (long)&PTR__IfcPresentationStyle_00918ab8;
  if ((long *)plVar1[-2] != plVar1) {
    operator_delete((long *)plVar1[-2],*plVar1 + 1);
  }
  operator_delete((_func_int *)
                  ((long)&(this->
                          super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>).
                          _vptr_ObjectHelper + (long)p_Var2),0x50);
  return;
}

Assistant:

IfcPresentationStyle() : Object("IfcPresentationStyle") {}